

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

bill_x * onbill(obj *obj,monst *shkp,boolean silent)

{
  int iVar1;
  bill_x *pbVar2;
  char *line;
  
  if (shkp != (monst *)0x0) {
    pbVar2 = *(bill_x **)&shkp[0x1b].mnum;
    for (iVar1 = (int)*(short *)((long)&shkp[0x1b].misc_worn_check + 2); 0 < iVar1;
        iVar1 = iVar1 + -1) {
      if (pbVar2->bo_id == obj->o_id) {
        if ((obj->field_0x4a & 4) != 0) {
          return pbVar2;
        }
        line = "onbill: paid obj on bill?";
        goto LAB_0022ab89;
      }
      pbVar2 = pbVar2 + 1;
    }
  }
  pbVar2 = (bill_x *)0x0;
  if ((silent == '\0') && ((*(uint *)&obj->field_0x4a & 4) != 0)) {
    line = "onbill: unpaid obj not on bill?";
LAB_0022ab89:
    pline(line);
  }
  return pbVar2;
}

Assistant:

static struct bill_x *onbill(const struct obj *obj, struct monst *shkp, boolean silent)
{
	if (shkp) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		while (--ct >= 0)
		    if (bp->bo_id == obj->o_id) {
			if (!obj->unpaid) pline("onbill: paid obj on bill?");
			return bp;
		    } else bp++;
	}
	if (obj->unpaid && !silent) pline("onbill: unpaid obj not on bill?");
	return NULL;
}